

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O0

int XLearnGetInt(XL *out,char *key,int *value)

{
  XLearn *this;
  int iVar1;
  HyperParam *pHVar2;
  index_t *in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  runtime_error *_except_;
  XLearn *xl;
  
  this = (XLearn *)*in_RDI;
  iVar1 = strcmp(in_RSI,"k");
  if (iVar1 == 0) {
    pHVar2 = XLearn::GetHyperParam(this);
    *in_RDX = pHVar2->num_K;
  }
  else {
    iVar1 = strcmp(in_RSI,"epoch");
    if (iVar1 == 0) {
      pHVar2 = XLearn::GetHyperParam(this);
      *in_RDX = pHVar2->num_epoch;
    }
    else {
      iVar1 = strcmp(in_RSI,"fold");
      if (iVar1 == 0) {
        pHVar2 = XLearn::GetHyperParam(this);
        *in_RDX = pHVar2->num_folds;
      }
      else {
        iVar1 = strcmp(in_RSI,"block_size");
        if (iVar1 == 0) {
          pHVar2 = XLearn::GetHyperParam(this);
          *in_RDX = pHVar2->block_size;
        }
        else {
          iVar1 = strcmp(in_RSI,"nthread");
          if (iVar1 == 0) {
            pHVar2 = XLearn::GetHyperParam(this);
            *in_RDX = pHVar2->thread_number;
          }
          else {
            iVar1 = strcmp(in_RSI,"stop_window");
            if (iVar1 == 0) {
              pHVar2 = XLearn::GetHyperParam(this);
              *in_RDX = pHVar2->stop_window;
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

XL_DLL int XLearnGetInt(XL *out, const char *key, int *value) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  if (strcmp(key, "k") == 0) {
    *value = xl->GetHyperParam().num_K;
  } else if (strcmp(key, "epoch") == 0) {
    *value = xl->GetHyperParam().num_epoch;
  } else if (strcmp(key, "fold") == 0) {
    *value = xl->GetHyperParam().num_folds;
  } else if (strcmp(key, "block_size") == 0) {
    *value = xl->GetHyperParam().block_size;
  } else if (strcmp(key, "nthread") == 0) {
    *value = xl->GetHyperParam().thread_number;
  } else if (strcmp(key, "stop_window") == 0) {
    *value = xl->GetHyperParam().stop_window;
  }
  API_END();
}